

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

string * utilities::rtrim(string *__return_storage_ptr__,string *s)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find_last_not_of((char *)s,WHITESPACE_abi_cxx11_,0xffffffffffffffff)
  ;
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string rtrim(const std::string& s)
    {
        size_t end = s.find_last_not_of(WHITESPACE);
        return (end == std::string::npos) ? "" : s.substr(0, end + 1);
    }